

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int cvLsBandDQJac(realtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,CVodeMem cv_mem,N_Vector tmp1,
                 N_Vector tmp2)

{
  double dVar1;
  long lVar2;
  sunindextype sVar3;
  sunindextype sVar4;
  sunindextype sVar5;
  int iVar6;
  int iVar7;
  realtype *prVar8;
  realtype *prVar9;
  realtype *prVar10;
  realtype *prVar11;
  realtype *prVar12;
  realtype *prVar13;
  long in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  realtype rVar14;
  int retval;
  CVLsMem cvls_mem;
  sunindextype mlower;
  sunindextype mupper;
  sunindextype N;
  sunindextype i2;
  sunindextype i1;
  sunindextype ngroups;
  sunindextype width;
  sunindextype j;
  sunindextype i;
  sunindextype group;
  realtype *cns_data;
  realtype *ytemp_data;
  realtype *y_data;
  realtype *ftemp_data;
  realtype *fy_data;
  realtype *ewt_data;
  realtype *col_j;
  realtype conj;
  realtype srur;
  realtype inc_inv;
  realtype inc;
  realtype minInc;
  realtype fnorm;
  N_Vector ytemp;
  N_Vector ftemp;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  N_Vector in_stack_fffffffffffffef0;
  double local_108;
  int local_fc;
  double local_f8;
  double local_f0;
  int local_bc;
  int local_b8;
  int local_b4;
  realtype *local_b0;
  double local_60;
  
  local_b0 = (realtype *)0x0;
  lVar2 = *(long *)(in_RCX + 0x408);
  sVar3 = SUNBandMatrix_Columns
                    ((SUNMatrix)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  sVar4 = SUNBandMatrix_UpperBandwidth
                    ((SUNMatrix)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  sVar5 = SUNBandMatrix_LowerBandwidth
                    ((SUNMatrix)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  prVar8 = N_VGetArrayPointer((N_Vector)0xefdddc);
  prVar9 = N_VGetArrayPointer((N_Vector)0xefddf1);
  prVar10 = N_VGetArrayPointer((N_Vector)0xefde06);
  prVar11 = N_VGetArrayPointer((N_Vector)0xefde1b);
  prVar12 = N_VGetArrayPointer((N_Vector)0xefde2d);
  if (*(int *)(in_RCX + 0x58) != 0) {
    local_b0 = N_VGetArrayPointer((N_Vector)0xefde54);
  }
  N_VScale((realtype)in_stack_fffffffffffffef0,
           (N_Vector)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
           (N_Vector)0xefde76);
  if (0.0 < *(double *)(in_RCX + 8)) {
    local_f0 = sqrt(*(double *)(in_RCX + 8));
  }
  else {
    local_f0 = 0.0;
  }
  rVar14 = N_VWrmsNorm(in_stack_fffffffffffffef0,
                       (N_Vector)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if ((rVar14 != 0.0) || (NAN(rVar14))) {
    local_f8 = ABS(*(double *)(in_RCX + 0x140)) * 1000.0 * *(double *)(in_RCX + 8) * (double)sVar3 *
               rVar14;
  }
  else {
    local_f8 = 1.0;
  }
  iVar6 = sVar5 + sVar4 + 1;
  local_fc = sVar3;
  if (iVar6 < sVar3) {
    local_fc = iVar6;
  }
  local_b4 = 1;
  while( true ) {
    if (local_fc < local_b4) {
      return 0;
    }
    for (local_bc = local_b4 + -1; local_bc < sVar3; local_bc = iVar6 + local_bc) {
      if (local_f0 * ABS(prVar11[local_bc]) <= local_f8 / prVar8[local_bc]) {
        local_108 = local_f8 / prVar8[local_bc];
      }
      else {
        local_108 = local_f0 * ABS(prVar11[local_bc]);
      }
      local_60 = local_108;
      if (*(int *)(in_RCX + 0x58) != 0) {
        dVar1 = local_b0[local_bc];
        if ((ABS(dVar1) != 1.0) || (NAN(ABS(dVar1)))) {
          if ((ABS(dVar1) == 2.0) &&
             ((!NAN(ABS(dVar1)) && ((prVar12[local_bc] + local_108) * dVar1 <= 0.0)))) {
            local_60 = -local_108;
          }
        }
        else if ((prVar12[local_bc] + local_108) * dVar1 < 0.0) {
          local_60 = -local_108;
        }
      }
      prVar12[local_bc] = local_60 + prVar12[local_bc];
    }
    iVar7 = (**(code **)(in_RCX + 0x10))
                      (*(undefined8 *)(in_RCX + 0x168),in_R9,in_R8,*(undefined8 *)(in_RCX + 0x18));
    *(long *)(lVar2 + 0x90) = *(long *)(lVar2 + 0x90) + 1;
    if (iVar7 != 0) break;
    for (local_bc = local_b4 + -1; local_bc < sVar3; local_bc = iVar6 + local_bc) {
      prVar12[local_bc] = prVar11[local_bc];
      prVar13 = SUNBandMatrix_Column
                          ((SUNMatrix)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                           0);
      if (local_f0 * ABS(prVar11[local_bc]) <= local_f8 / prVar8[local_bc]) {
        local_60 = local_f8 / prVar8[local_bc];
      }
      else {
        local_60 = local_f0 * ABS(prVar11[local_bc]);
      }
      if (*(int *)(in_RCX + 0x58) != 0) {
        dVar1 = local_b0[local_bc];
        if ((ABS(dVar1) != 1.0) || (NAN(ABS(dVar1)))) {
          if ((ABS(dVar1) == 2.0) &&
             ((!NAN(ABS(dVar1)) && ((prVar12[local_bc] + local_60) * dVar1 <= 0.0)))) {
            local_60 = -local_60;
          }
        }
        else if ((prVar12[local_bc] + local_60) * dVar1 < 0.0) {
          local_60 = -local_60;
        }
      }
      if (local_bc - sVar4 < 0) {
        in_stack_fffffffffffffeec = 0;
      }
      else {
        in_stack_fffffffffffffeec = local_bc - sVar4;
      }
      local_b8 = in_stack_fffffffffffffeec;
      if (local_bc + sVar5 < sVar3 + -1) {
        in_stack_fffffffffffffee8 = local_bc + sVar5;
      }
      else {
        in_stack_fffffffffffffee8 = sVar3 + -1;
      }
      for (; local_b8 <= in_stack_fffffffffffffee8; local_b8 = local_b8 + 1) {
        prVar13[local_b8 - local_bc] = (1.0 / local_60) * (prVar10[local_b8] - prVar9[local_b8]);
      }
    }
    local_b4 = local_b4 + 1;
  }
  return iVar7;
}

Assistant:

int cvLsBandDQJac(realtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
                  CVodeMem cv_mem, N_Vector tmp1, N_Vector tmp2)
{
  N_Vector ftemp, ytemp;
  realtype fnorm, minInc, inc, inc_inv, srur, conj;
  realtype *col_j, *ewt_data, *fy_data, *ftemp_data;
  realtype *y_data, *ytemp_data, *cns_data;
  sunindextype group, i, j, width, ngroups, i1, i2;
  sunindextype N, mupper, mlower;
  CVLsMem cvls_mem;
  int retval = 0;

  /* initialize cns_data to avoid compiler warning */
  cns_data = NULL;

  /* access LsMem interface structure */
  cvls_mem = (CVLsMem) cv_mem->cv_lmem;

  /* access matrix dimensions */
  N = SUNBandMatrix_Columns(Jac);
  mupper = SUNBandMatrix_UpperBandwidth(Jac);
  mlower = SUNBandMatrix_LowerBandwidth(Jac);

  /* Rename work vectors for use as temporary values of y and f */
  ftemp = tmp1;
  ytemp = tmp2;

  /* Obtain pointers to the data for ewt, fy, ftemp, y, ytemp */
  ewt_data   = N_VGetArrayPointer(cv_mem->cv_ewt);
  fy_data    = N_VGetArrayPointer(fy);
  ftemp_data = N_VGetArrayPointer(ftemp);
  y_data     = N_VGetArrayPointer(y);
  ytemp_data = N_VGetArrayPointer(ytemp);
  if (cv_mem->cv_constraintsSet)
    cns_data = N_VGetArrayPointer(cv_mem->cv_constraints);

  /* Load ytemp with y = predicted y vector */
  N_VScale(ONE, y, ytemp);

  /* Set minimum increment based on uround and norm of f */
  srur = SUNRsqrt(cv_mem->cv_uround);
  fnorm = N_VWrmsNorm(fy, cv_mem->cv_ewt);
  minInc = (fnorm != ZERO) ?
    (MIN_INC_MULT * SUNRabs(cv_mem->cv_h) * cv_mem->cv_uround * N * fnorm) : ONE;

  /* Set bandwidth and number of column groups for band differencing */
  width = mlower + mupper + 1;
  ngroups = SUNMIN(width, N);

  /* Loop over column groups. */
  for (group=1; group <= ngroups; group++) {

    /* Increment all y_j in group */
    for(j=group-1; j < N; j+=width) {
      inc = SUNMAX(srur*SUNRabs(y_data[j]), minInc/ewt_data[j]);

      /* Adjust sign(inc) if yj has an inequality constraint. */
      if (cv_mem->cv_constraintsSet) {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)      {if ((ytemp_data[j]+inc)*conj < ZERO)  inc = -inc;}
        else if (SUNRabs(conj) == TWO) {if ((ytemp_data[j]+inc)*conj <= ZERO) inc = -inc;}
      }

      ytemp_data[j] += inc;
    }

    /* Evaluate f with incremented y */
    retval = cv_mem->cv_f(cv_mem->cv_tn, ytemp, ftemp, cv_mem->cv_user_data);
    cvls_mem->nfeDQ++;
    if (retval != 0) break;

    /* Restore ytemp, then form and load difference quotients */
    for (j=group-1; j < N; j+=width) {
      ytemp_data[j] = y_data[j];
      col_j = SUNBandMatrix_Column(Jac, j);
      inc = SUNMAX(srur*SUNRabs(y_data[j]), minInc/ewt_data[j]);

      /* Adjust sign(inc) as before. */
      if (cv_mem->cv_constraintsSet) {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)      {if ((ytemp_data[j]+inc)*conj < ZERO)  inc = -inc;}
        else if (SUNRabs(conj) == TWO) {if ((ytemp_data[j]+inc)*conj <= ZERO) inc = -inc;}
      }

      inc_inv = ONE/inc;
      i1 = SUNMAX(0, j-mupper);
      i2 = SUNMIN(j+mlower, N-1);
      for (i=i1; i <= i2; i++)
        SM_COLUMN_ELEMENT_B(col_j,i,j) = inc_inv * (ftemp_data[i] - fy_data[i]);
    }
  }

  return(retval);
}